

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O2

Sequence<DNA> * __thiscall
Sequence<DNA>::Reverse(Sequence<DNA> *__return_storage_ptr__,Sequence<DNA> *this)

{
  pointer pcVar1;
  
  Sequence(__return_storage_ptr__,this);
  pcVar1 = (__return_storage_ptr__->sequence)._M_dataplus._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + (__return_storage_ptr__->sequence)._M_string_length);
  pcVar1 = (__return_storage_ptr__->quality)._M_dataplus._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + (__return_storage_ptr__->quality)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

Sequence< A > Sequence< A >::Reverse() const {
  Sequence rev = *this;
  // Reverse sequence and quality
  std::reverse( rev.sequence.begin(), rev.sequence.end() );
  std::reverse( rev.quality.begin(), rev.quality.end() );
  return rev;
}